

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

bool __thiscall
spvtools::val::ValidationState_t::ContainsSizedIntOrFloatType
          (ValidationState_t *this,uint32_t id,Op type,uint32_t width)

{
  bool bVar1;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  if (type - OpTypeVector < 0xfffffffe) {
    bVar1 = false;
  }
  else {
    local_38._8_8_ = 0;
    local_38._M_unused._M_member_pointer = CONCAT44(width,type);
    pcStack_20 = std::
                 _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:1689:18)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validation_state.cpp:1689:18)>
               ::_M_manager;
    bVar1 = ContainsType(this,id,(function<bool_(const_spvtools::val::Instruction_*)> *)&local_38,
                         true);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  return bVar1;
}

Assistant:

bool ValidationState_t::ContainsSizedIntOrFloatType(uint32_t id, spv::Op type,
                                                    uint32_t width) const {
  if (type != spv::Op::OpTypeInt && type != spv::Op::OpTypeFloat) return false;

  const auto f = [type, width](const Instruction* inst) {
    if (inst->opcode() == type) {
      return inst->GetOperandAs<uint32_t>(1u) == width;
    }
    return false;
  };
  return ContainsType(id, f);
}